

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O1

string * __thiscall
LTFlightData::FDDynamicData::GetSquawk_abi_cxx11_
          (string *__return_storage_ptr__,FDDynamicData *this)

{
  size_t sVar1;
  char *pcVar2;
  char *__s;
  char s [10];
  char local_1a [10];
  
  if ((this->radar).code - 10000U < 0xffffffffffffd8f1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __s = "-";
    pcVar2 = "";
  }
  else {
    __s = local_1a;
    snprintf(__s,10,"%04ld");
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar1 = strlen(__s);
    pcVar2 = local_1a + sVar1;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string LTFlightData::FDDynamicData::GetSquawk() const
{
    if (radar.code <= 0 || radar.code > 9999)
        return "-";
    else
    {
        char s[10];
        snprintf(s, sizeof(s), "%04ld", radar.code);
        return std::string(s);
    }
}